

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O1

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::FixVariablePS::FixVariablePS
          (FixVariablePS *this,
          SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *lp,SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *simplifier,int _j,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *val,shared_ptr<soplex::Tolerances> *tols,bool correctIdx)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  element_type *peVar4;
  pointer pnVar5;
  Item *pIVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int32_t iVar10;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  peVar4 = (tols->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_b0._M_pi =
       (tols->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_b0._M_pi)->_M_use_count = (local_b0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_b0._M_pi)->_M_use_count = (local_b0._M_pi)->_M_use_count + 1;
    }
  }
  iVar2 = (lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  iVar3 = (lp->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__PostStep_006af140;
  (this->super_PostStep).m_name = "FixVariable";
  (this->super_PostStep).nCols = iVar3;
  (this->super_PostStep).nRows = iVar2;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_PostStep)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_b0);
  if (local_b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0._M_pi);
  }
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__FixVariablePS_006af630;
  this->m_j = _j;
  this->m_old_j =
       (lp->
       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).
       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       .set.thenum + -1;
  uVar7 = *(undefined8 *)((val->m_backend).data._M_elems + 2);
  uVar8 = *(undefined8 *)((val->m_backend).data._M_elems + 4);
  uVar9 = *(undefined8 *)((val->m_backend).data._M_elems + 6);
  *(undefined8 *)(this->m_val).m_backend.data._M_elems =
       *(undefined8 *)(val->m_backend).data._M_elems;
  *(undefined8 *)((this->m_val).m_backend.data._M_elems + 2) = uVar7;
  *(undefined8 *)((this->m_val).m_backend.data._M_elems + 4) = uVar8;
  *(undefined8 *)((this->m_val).m_backend.data._M_elems + 6) = uVar9;
  *(undefined8 *)((this->m_val).m_backend.data._M_elems + 8) =
       *(undefined8 *)((val->m_backend).data._M_elems + 8);
  (this->m_val).m_backend.exp = (val->m_backend).exp;
  (this->m_val).m_backend.neg = (val->m_backend).neg;
  iVar10 = (val->m_backend).prec_elem;
  (this->m_val).m_backend.fpclass = (val->m_backend).fpclass;
  (this->m_val).m_backend.prec_elem = iVar10;
  if (lp->thesense == MINIMIZE) {
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::obj(&this->m_obj,lp,_j);
  }
  else {
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::obj((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_68,lp,_j);
    *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 8) = local_68.data._M_elems._32_8_;
    *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 4) = local_68.data._M_elems._16_8_;
    *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 6) = local_68.data._M_elems._24_8_;
    *(undefined8 *)(this->m_obj).m_backend.data._M_elems = local_68.data._M_elems._0_8_;
    *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 2) = local_68.data._M_elems._8_8_;
    (this->m_obj).m_backend.exp = local_68.exp;
    (this->m_obj).m_backend.neg = local_68.neg;
    (this->m_obj).m_backend.fpclass = local_68.fpclass;
    (this->m_obj).m_backend.prec_elem = local_68.prec_elem;
    if (local_68.fpclass != cpp_dec_float_finite || (this->m_obj).m_backend.data._M_elems[0] != 0) {
      (this->m_obj).m_backend.neg = (bool)(local_68.neg ^ 1);
    }
  }
  pnVar5 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).low.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)((this->m_lower).m_backend.data._M_elems + 8) =
       *(undefined8 *)(pnVar5[_j].m_backend.data._M_elems + 8);
  uVar7 = *(undefined8 *)&pnVar5[_j].m_backend.data;
  uVar8 = *(undefined8 *)(pnVar5[_j].m_backend.data._M_elems + 2);
  puVar1 = pnVar5[_j].m_backend.data._M_elems + 4;
  uVar9 = *(undefined8 *)(puVar1 + 2);
  *(undefined8 *)((this->m_lower).m_backend.data._M_elems + 4) = *(undefined8 *)puVar1;
  *(undefined8 *)((this->m_lower).m_backend.data._M_elems + 6) = uVar9;
  *(undefined8 *)(this->m_lower).m_backend.data._M_elems = uVar7;
  *(undefined8 *)((this->m_lower).m_backend.data._M_elems + 2) = uVar8;
  (this->m_lower).m_backend.exp = pnVar5[_j].m_backend.exp;
  (this->m_lower).m_backend.neg = pnVar5[_j].m_backend.neg;
  iVar10 = pnVar5[_j].m_backend.prec_elem;
  (this->m_lower).m_backend.fpclass = pnVar5[_j].m_backend.fpclass;
  (this->m_lower).m_backend.prec_elem = iVar10;
  pnVar5 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).up.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)((this->m_upper).m_backend.data._M_elems + 8) =
       *(undefined8 *)(pnVar5[_j].m_backend.data._M_elems + 8);
  uVar7 = *(undefined8 *)&pnVar5[_j].m_backend.data;
  uVar8 = *(undefined8 *)(pnVar5[_j].m_backend.data._M_elems + 2);
  puVar1 = pnVar5[_j].m_backend.data._M_elems + 4;
  uVar9 = *(undefined8 *)(puVar1 + 2);
  *(undefined8 *)((this->m_upper).m_backend.data._M_elems + 4) = *(undefined8 *)puVar1;
  *(undefined8 *)((this->m_upper).m_backend.data._M_elems + 6) = uVar9;
  *(undefined8 *)(this->m_upper).m_backend.data._M_elems = uVar7;
  *(undefined8 *)((this->m_upper).m_backend.data._M_elems + 2) = uVar8;
  (this->m_upper).m_backend.exp = pnVar5[_j].m_backend.exp;
  (this->m_upper).m_backend.neg = pnVar5[_j].m_backend.neg;
  iVar10 = pnVar5[_j].m_backend.prec_elem;
  (this->m_upper).m_backend.fpclass = pnVar5[_j].m_backend.fpclass;
  (this->m_upper).m_backend.prec_elem = iVar10;
  this->m_correctIdx = correctIdx;
  pIVar6 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.theitem;
  iVar2 = (lp->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thekey[_j].idx;
  (this->m_col).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_elem = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x0;
  (this->m_col).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memsize = 0;
  (this->m_col).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memused = 0;
  (this->m_col)._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006adc40;
  (this->m_col).theelem =
       (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::allocMem(&this->m_col,
             pIVar6[iVar2].data.
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .memused);
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator=(&(this->m_col).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ,(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)(pIVar6 + iVar2));
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::obj((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
         *)&local_68,lp,this->m_j);
  local_a8.fpclass = cpp_dec_float_finite;
  local_a8.prec_elem = 10;
  local_a8.data._M_elems[0] = 0;
  local_a8.data._M_elems[1] = 0;
  local_a8.data._M_elems[2] = 0;
  local_a8.data._M_elems[3] = 0;
  local_a8.data._M_elems[4] = 0;
  local_a8.data._M_elems[5] = 0;
  local_a8.data._M_elems._24_5_ = 0;
  local_a8.data._M_elems[7]._1_3_ = 0;
  local_a8.data._M_elems._32_5_ = 0;
  local_a8.data._M_elems[9]._1_3_ = 0;
  local_a8.exp = 0;
  local_a8.neg = false;
  if (&local_a8 != &(this->m_val).m_backend) {
    uVar7 = *(undefined8 *)((this->m_val).m_backend.data._M_elems + 8);
    local_a8.data._M_elems._32_5_ = SUB85(uVar7,0);
    local_a8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
    local_a8.data._M_elems._0_8_ = *(undefined8 *)(this->m_val).m_backend.data._M_elems;
    local_a8.data._M_elems._8_8_ = *(undefined8 *)((this->m_val).m_backend.data._M_elems + 2);
    local_a8.data._M_elems._16_8_ = *(undefined8 *)((this->m_val).m_backend.data._M_elems + 4);
    uVar7 = *(undefined8 *)((this->m_val).m_backend.data._M_elems + 6);
    local_a8.data._M_elems._24_5_ = SUB85(uVar7,0);
    local_a8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
    local_a8.exp = (this->m_val).m_backend.exp;
    local_a8.neg = (this->m_val).m_backend.neg;
    local_a8.fpclass = (this->m_val).m_backend.fpclass;
    local_a8.prec_elem = (this->m_val).m_backend.prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_a8,&local_68);
  (*(simplifier->
    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    )._vptr_SPxSimplifier[0x11])(simplifier,&local_a8);
  return;
}

Assistant:

FixVariablePS(const SPxLPBase<R>& lp, SPxMainSM& simplifier, int _j, const R val,
                    std::shared_ptr<Tolerances> tols, bool correctIdx = true)
         : PostStep("FixVariable", tols, lp.nRows(), lp.nCols())
         , m_j(_j)
         , m_old_j(lp.nCols() - 1)
         , m_val(val)
         , m_obj(lp.spxSense() == SPxLPBase<R>::MINIMIZE ? lp.obj(_j) : -lp.obj(_j))
         , m_lower(lp.lower(_j))
         , m_upper(lp.upper(_j))
         , m_correctIdx(correctIdx)
         , m_col(lp.colVector(_j))
      {
         simplifier.addObjoffset(m_val * lp.obj(m_j));
      }